

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfWav.cpp
# Opt level: O2

void Imf_3_4::wav2Decode(unsigned_short *in,int nx,int ox,int ny,int oy,unsigned_short mx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ushort *puVar4;
  ushort uVar5;
  short sVar6;
  short hs_1;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  unsigned_short *puVar11;
  ushort uVar12;
  ushort *puVar13;
  ushort *local_50;
  
  iVar3 = ny;
  if (nx < ny) {
    iVar3 = nx;
  }
  iVar9 = 1;
  do {
    iVar10 = iVar9;
    iVar9 = iVar10 * 2;
  } while (iVar10 <= iVar3);
  uVar2 = iVar10 >> 1;
  for (uVar1 = iVar10 >> 2; 0 < (int)uVar1; uVar1 = uVar1 >> 1) {
    iVar9 = uVar1 * ox;
    iVar3 = uVar2 * ox;
    iVar10 = (nx - uVar2) * ox;
    local_50 = in + (int)(uVar1 * oy);
    for (puVar11 = in; puVar11 <= in + (int)((ny - uVar2) * oy);
        puVar11 = puVar11 + (int)(uVar2 * oy)) {
      puVar4 = local_50;
      for (puVar13 = puVar11; puVar13 <= puVar11 + iVar10; puVar13 = puVar13 + iVar3) {
        uVar5 = *puVar4;
        if (mx < 0x4000) {
          sVar6 = ((short)uVar5 >> 1) + *puVar13 + (uVar5 & 1);
          uVar12 = puVar4[iVar9];
          uVar8 = ((short)uVar12 >> 1) + (uVar12 & 1) + puVar13[iVar9];
          uVar7 = ((short)uVar8 >> 1) + (uVar8 & 1) + sVar6;
          *puVar13 = uVar7;
          uVar12 = uVar8 - uVar12;
          puVar13[iVar9] = uVar7 - uVar8;
          uVar5 = ((short)uVar12 >> 1) + (uVar12 & 1) + (sVar6 - uVar5);
          *puVar4 = uVar5;
          puVar4[iVar9] = uVar5 - uVar12;
        }
        else {
          sVar6 = *puVar13 - (uVar5 >> 1);
          uVar12 = puVar13[iVar9] - (puVar4[iVar9] >> 1);
          uVar8 = puVar4[iVar9] + uVar12 ^ 0x8000;
          uVar5 = (sVar6 + uVar5 ^ 0x8000) - (uVar8 >> 1);
          puVar13[iVar9] = uVar5;
          *puVar13 = uVar5 + uVar8 ^ 0x8000;
          uVar5 = sVar6 - (uVar12 >> 1);
          puVar4[iVar9] = uVar5;
          *puVar4 = uVar5 + uVar12 ^ 0x8000;
        }
        puVar4 = puVar4 + iVar3;
      }
      if ((nx & uVar1) != 0) {
        uVar5 = *puVar4;
        if (mx < 0x4000) {
          uVar8 = ((short)uVar5 >> 1) + *puVar13 + (uVar5 & 1);
          uVar12 = uVar8 - uVar5;
        }
        else {
          uVar12 = *puVar13 - (uVar5 >> 1);
          uVar8 = uVar12 + uVar5 ^ 0x8000;
        }
        *puVar4 = uVar12;
        *puVar13 = uVar8;
      }
      local_50 = local_50 + (int)(uVar2 * oy);
    }
    if ((ny & uVar1) != 0) {
      puVar4 = puVar11 + iVar10;
      for (; puVar11 <= puVar4; puVar11 = puVar11 + iVar3) {
        uVar5 = puVar11[iVar9];
        if (mx < 0x4000) {
          uVar8 = ((short)uVar5 >> 1) + *puVar11 + (uVar5 & 1);
          uVar12 = uVar8 - uVar5;
        }
        else {
          uVar12 = *puVar11 - (uVar5 >> 1);
          uVar8 = uVar12 + uVar5 ^ 0x8000;
        }
        puVar11[iVar9] = uVar12;
        *puVar11 = uVar8;
      }
    }
    uVar2 = uVar1;
  }
  return;
}

Assistant:

void
wav2Decode (
    unsigned short* in, // io: values are transformed in place
    int             nx, // i : x size
    int             ox, // i : x offset
    int             ny, // i : y size
    int             oy, // i : y offset
    unsigned short  mx)  // i : maximum in[x][y] value
{
    bool w14 = (mx < (1 << 14));
    int  n   = (nx > ny) ? ny : nx;
    int  p   = 1;
    int  p2;

    //
    // Search max level
    //

    while (p <= n)
        p <<= 1;

    p >>= 1;
    p2 = p;
    p >>= 1;

    //
    // Hierarchical loop on smaller dimension n
    //

    while (p >= 1)
    {
        unsigned short* py  = in;
        unsigned short* ey  = in + oy * (ny - p2);
        int             oy1 = oy * p;
        int             oy2 = oy * p2;
        int             ox1 = ox * p;
        int             ox2 = ox * p2;
        unsigned short  i00, i01, i10, i11;

        //
        // Y loop
        //

        for (; py <= ey; py += oy2)
        {
            unsigned short* px = py;
            unsigned short* ex = py + ox * (nx - p2);

            //
            // X loop
            //

            for (; px <= ex; px += ox2)
            {
                unsigned short* p01 = px + ox1;
                unsigned short* p10 = px + oy1;
                unsigned short* p11 = p10 + ox1;

                //
                // 2D wavelet decoding
                //

                if (w14)
                {
                    wdec14 (*px, *p10, i00, i10);
                    wdec14 (*p01, *p11, i01, i11);
                    wdec14 (i00, i01, *px, *p01);
                    wdec14 (i10, i11, *p10, *p11);
                }
                else
                {
                    wdec16 (*px, *p10, i00, i10);
                    wdec16 (*p01, *p11, i01, i11);
                    wdec16 (i00, i01, *px, *p01);
                    wdec16 (i10, i11, *p10, *p11);
                }
            }

            //
            // Decode (1D) odd column (still in Y loop)
            //

            if (nx & p)
            {
                unsigned short* p10 = px + oy1;

                if (w14)
                    wdec14 (*px, *p10, i00, *p10);
                else
                    wdec16 (*px, *p10, i00, *p10);

                *px = i00;
            }
        }

        //
        // Decode (1D) odd line (must loop in X)
        //

        if (ny & p)
        {
            unsigned short* px = py;
            unsigned short* ex = py + ox * (nx - p2);

            for (; px <= ex; px += ox2)
            {
                unsigned short* p01 = px + ox1;

                if (w14)
                    wdec14 (*px, *p01, i00, *p01);
                else
                    wdec16 (*px, *p01, i00, *p01);

                *px = i00;
            }
        }

        //
        // Next level
        //

        p2 = p;
        p >>= 1;
    }
}